

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *pDst
          ,uint x,uint y,uint w,uint h,bool flip_xy)

{
  ulong uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint y_ofs;
  uint uVar7;
  bool bVar8;
  
  if ((x < this->m_width) && (y < this->m_height)) {
    uVar5 = (ulong)x;
    if (flip_xy) {
      uVar1 = 0;
      while (uVar7 = (uint)uVar1, uVar7 != h) {
        uVar4 = (ulong)w;
        uVar6 = uVar5;
        while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
          pcVar2 = get_clamped(this,(int)uVar6,uVar7 + y);
          pDst[uVar1].field_0.field_0.r = (pcVar2->field_0).field_0.r;
          pDst[uVar1].field_0.field_0.g = (pcVar2->field_0).field_0.g;
          pDst[uVar1].field_0.field_0.b = (pcVar2->field_0).field_0.b;
          pDst[uVar1].field_0.field_0.a = (pcVar2->field_0).field_0.a;
          uVar1 = (ulong)((int)uVar1 + h);
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        uVar1 = (ulong)(uVar7 + 1);
      }
    }
    else if (this->m_width < w + x || this->m_height < h + y) {
      for (uVar7 = 0; uVar7 != h; uVar7 = uVar7 + 1) {
        uVar1 = uVar5;
        uVar3 = w;
        while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
          pcVar2 = get_clamped(this,(int)uVar1,y + uVar7);
          (pDst->field_0).field_0.r = (pcVar2->field_0).field_0.r;
          (pDst->field_0).field_0.g = (pcVar2->field_0).field_0.g;
          (pDst->field_0).field_0.b = (pcVar2->field_0).field_0.b;
          (pDst->field_0).field_0.a = (pcVar2->field_0).field_0.a;
          pDst = pDst + 1;
          uVar1 = (ulong)((int)uVar1 + 1);
        }
      }
    }
    else {
      pcVar2 = this->m_pPixels + y * this->m_pitch + uVar5;
      while (bVar8 = h != 0, h = h - 1, bVar8) {
        memcpy(pDst,pcVar2,(ulong)w * 4);
        pcVar2 = pcVar2 + this->m_pitch;
        pDst = pDst + w;
      }
    }
    bVar8 = true;
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool extract_block(color_type* pDst, uint x, uint y, uint w, uint h, bool flip_xy = false) const
        {
            if ((x >= m_width) || (y >= m_height))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (flip_xy)
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        pDst[x_ofs * h + y_ofs] = get_clamped(x_ofs + x, y_ofs + y); // 5/4/12 - this was incorrectly x_ofs * 4
                    }
                }
            }
            else if (((x + w) > m_width) || ((y + h) > m_height))
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        *pDst++ = get_clamped(x_ofs + x, y_ofs + y);
                    }
                }
            }
            else
            {
                const color_type* pSrc = get_scanline(y) + x;

                for (uint i = h; i; i--)
                {
                    memcpy(pDst, pSrc, w * sizeof(color_type));
                    pDst += w;

                    pSrc += m_pitch;
                }
            }

            return true;
        }